

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

char * mg_md5(char *buf,...)

{
  md5_byte_t *data_00;
  byte bVar1;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  char in_AL;
  void **ppvVar9;
  size_t nbytes;
  long lVar10;
  uint uVar11;
  undefined8 in_RCX;
  ulong uVar12;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar13;
  undefined8 in_XMM0_Qa;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 in_XMM4_Qa;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined4 in_XMM7_Da;
  va_list ap;
  md5_byte_t data [8];
  md5_byte_t hash [16];
  void **local_150;
  md5_byte_t local_140 [8];
  byte abStack_138 [16];
  md5_state_t local_128;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Da;
  }
  local_128.count[0] = 0;
  local_128.count[1] = 0;
  local_128.abcd[0] = 0x67452301;
  local_128.abcd[1] = 0xefcdab89;
  local_128.abcd[2] = 0x98badcfe;
  local_128.abcd[3] = 0x10325476;
  uVar11 = 8;
  local_150 = &ap[0].overflow_arg_area;
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while( true ) {
    uVar12 = (ulong)uVar11;
    if (uVar12 < 0x29) {
      uVar11 = uVar11 + 8;
      ppvVar9 = (void **)((long)local_c8 + uVar12);
    }
    else {
      ppvVar9 = local_150;
      local_150 = local_150 + 1;
    }
    data_00 = (md5_byte_t *)*ppvVar9;
    if (data_00 == (md5_byte_t *)0x0) break;
    nbytes = strlen((char *)data_00);
    md5_append(&local_128,data_00,nbytes);
  }
  iVar13 = 0;
  iVar14 = 1;
  iVar15 = 2;
  iVar16 = 3;
  lVar10 = 0;
  do {
    uVar11 = *(uint *)((long)local_128.count + lVar10);
    auVar17._0_4_ = iVar13 << 3;
    auVar17._4_4_ = iVar14 << 3;
    auVar17._8_4_ = iVar15 << 3;
    auVar17._12_4_ = iVar16 << 3;
    auVar17 = auVar17 & _DAT_0012a640;
    auVar19 = pshuflw(in_XMM3,auVar17,0xfe);
    uVar21 = uVar11 >> auVar19._0_8_;
    auVar20 = pshuflw(auVar19,auVar17,0x54);
    uVar23 = uVar11 >> auVar20._0_8_;
    auVar19._8_4_ = auVar17._8_4_;
    auVar19._12_4_ = auVar17._12_4_;
    auVar19._0_8_ = auVar17._8_8_;
    in_XMM3 = pshuflw(auVar20,auVar19,0xfe);
    uVar22 = uVar11 >> in_XMM3._0_8_;
    auVar17 = pshuflw(auVar19,auVar19,0x54);
    uVar11 = uVar11 >> auVar17._0_8_;
    uVar5 = (ushort)uVar23 & 0xff;
    uVar6 = (ushort)uVar21 & 0xff;
    uVar7 = (ushort)uVar11 & 0xff;
    uVar8 = (ushort)uVar22 & 0xff;
    bVar1 = ((uVar23 & 0xff) != 0) * (uVar5 < 0x100) * (char)uVar23 - (0xff < uVar5);
    bVar2 = ((uVar21 & 0xff) != 0) * (uVar6 < 0x100) * (char)uVar21 - (0xff < uVar6);
    bVar3 = ((uVar11 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar11 - (0xff < uVar7);
    bVar4 = ((uVar22 & 0xff) != 0) * (uVar8 < 0x100) * (char)uVar22 - (0xff < uVar8);
    *(uint *)(local_140 + lVar10) =
         CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                  CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                    (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))));
    lVar10 = lVar10 + 4;
    iVar13 = iVar13 + 4;
    iVar14 = iVar14 + 4;
    iVar15 = iVar15 + 4;
    iVar16 = iVar16 + 4;
  } while (lVar10 != 8);
  md5_append(&local_128,md5_finish_pad,(ulong)((0x37 - (local_128.count[0] >> 3) & 0x3f) + 1));
  md5_append(&local_128,local_140,8);
  iVar13 = 0;
  iVar14 = 1;
  iVar15 = 2;
  iVar16 = 3;
  lVar10 = 0;
  do {
    uVar11 = *(uint *)((long)local_128.abcd + lVar10);
    auVar20._0_4_ = iVar13 << 3;
    auVar20._4_4_ = iVar14 << 3;
    auVar20._8_4_ = iVar15 << 3;
    auVar20._12_4_ = iVar16 << 3;
    auVar20 = auVar20 & _DAT_0012a640;
    auVar17 = pshuflw(in_XMM3,auVar20,0xfe);
    uVar21 = uVar11 >> auVar17._0_8_;
    auVar17 = pshuflw(auVar17,auVar20,0x54);
    uVar23 = uVar11 >> auVar17._0_8_;
    auVar18._8_4_ = auVar20._8_4_;
    auVar18._12_4_ = auVar20._12_4_;
    auVar18._0_8_ = auVar20._8_8_;
    in_XMM3 = pshuflw(auVar17,auVar18,0xfe);
    uVar22 = uVar11 >> in_XMM3._0_8_;
    auVar17 = pshuflw(auVar18,auVar18,0x54);
    uVar11 = uVar11 >> auVar17._0_8_;
    uVar5 = (ushort)uVar23 & 0xff;
    uVar6 = (ushort)uVar21 & 0xff;
    uVar7 = (ushort)uVar11 & 0xff;
    uVar8 = (ushort)uVar22 & 0xff;
    bVar1 = ((uVar23 & 0xff) != 0) * (uVar5 < 0x100) * (char)uVar23 - (0xff < uVar5);
    bVar2 = ((uVar21 & 0xff) != 0) * (uVar6 < 0x100) * (char)uVar21 - (0xff < uVar6);
    bVar3 = ((uVar11 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar11 - (0xff < uVar7);
    bVar4 = ((uVar22 & 0xff) != 0) * (uVar8 < 0x100) * (char)uVar22 - (0xff < uVar8);
    *(uint *)(abStack_138 + lVar10) =
         CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                  CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                           CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                    (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))));
    lVar10 = lVar10 + 4;
    iVar13 = iVar13 + 4;
    iVar14 = iVar14 + 4;
    iVar15 = iVar15 + 4;
    iVar16 = iVar16 + 4;
  } while (lVar10 != 0x10);
  lVar10 = 0;
  do {
    bVar1 = abStack_138[lVar10];
    buf[lVar10 * 2] = "0123456789abcdef"[bVar1 >> 4];
    buf[lVar10 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  buf[0x20] = '\0';
  return buf;
}

Assistant:

CIVETWEB_API char *
mg_md5(char buf[33], ...)
{
	md5_byte_t hash[16];
	const char *p;
	va_list ap;
	md5_state_t ctx;

	md5_init(&ctx);

	va_start(ap, buf);
	while ((p = va_arg(ap, const char *)) != NULL) {
		md5_append(&ctx, (const md5_byte_t *)p, strlen(p));
	}
	va_end(ap);

	md5_finish(&ctx, hash);
	bin2str(buf, hash, sizeof(hash));
	return buf;
}